

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.c
# Opt level: O3

exr_result_t internal_exr_validate_read_part(_internal_exr_context *f,_internal_exr_part *curpart)

{
  exr_result_t eVar1;
  
  eVar1 = validate_req_attr(f,curpart,(uint)(f->strict_header == '\0'));
  if (eVar1 == 0) {
    eVar1 = validate_image_dimensions(f,curpart);
    if (eVar1 == 0) {
      eVar1 = validate_channels(f,curpart,(curpart->channels->field_6).chlist);
      if (eVar1 == 0) {
        eVar1 = validate_part_type(f,curpart);
        if (eVar1 == 0) {
          eVar1 = validate_tile_data(f,curpart);
          if (eVar1 == 0) {
            eVar1 = validate_deep_data(f,curpart);
            return eVar1;
          }
        }
      }
    }
  }
  return eVar1;
}

Assistant:

exr_result_t
internal_exr_validate_read_part (
    struct _internal_exr_context* f, struct _internal_exr_part* curpart)
{
    exr_result_t rv;

    rv = validate_req_attr (f, curpart, !f->strict_header);
    if (rv != EXR_ERR_SUCCESS) return rv;

    rv = validate_image_dimensions (f, curpart);
    if (rv != EXR_ERR_SUCCESS) return rv;

    rv = validate_channels (f, curpart, curpart->channels->chlist);
    if (rv != EXR_ERR_SUCCESS) return rv;

    rv = validate_part_type (f, curpart);
    if (rv != EXR_ERR_SUCCESS) return rv;

    rv = validate_tile_data (f, curpart);
    if (rv != EXR_ERR_SUCCESS) return rv;

    rv = validate_deep_data (f, curpart);
    if (rv != EXR_ERR_SUCCESS) return rv;

    return EXR_ERR_SUCCESS;
}